

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::KillLiveElems
          (GlobOpt *this,IndirOpnd *indirOpnd,Opnd *valueOpnd,
          BVSparse<Memory::JitArenaAllocator> *bv,bool inGlobOpt,Func *func)

{
  RegOpnd *pRVar1;
  BasicBlock *pBVar2;
  JitArenaAllocator *pJVar3;
  bool bVar4;
  Sym *sym;
  Value *pVVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  ValueInfo *pVVar6;
  int32 local_38;
  bool local_31;
  int indexLowerBound;
  bool isSafeToTransfer;
  
  pRVar1 = indirOpnd->m_indexOpnd;
  local_31 = true;
  if ((func->thisOrParentInlinerHasArguments != false) ||
     (bVar4 = IsNonNumericRegOpnd(this,pRVar1,inGlobOpt,&local_31), bVar4)) {
    KillAllFields(this,bv);
    this->func->anyPropertyMayBeWrittenTo = true;
    return;
  }
  if (!inGlobOpt) {
    return;
  }
  if (pRVar1 != (RegOpnd *)0x0) {
    pBVar2 = this->currentBlock;
    sym = IR::Opnd::GetSym(&pRVar1->super_Opnd);
    pVVar5 = GlobOptBlockData::FindValue(&pBVar2->globOptData,sym);
    if (pVVar5 != (Value *)0x0) {
      pVVar6 = pVVar5->valueInfo;
      goto LAB_0046a3a3;
    }
  }
  pVVar6 = (ValueInfo *)0x0;
LAB_0046a3a3:
  local_38 = 0;
  if (((local_31 != true) || (indirOpnd->m_offset < 0)) ||
     ((pRVar1 != (RegOpnd *)0x0 &&
      (((pVVar6 == (ValueInfo *)0x0 ||
        (bVar4 = ValueInfo::TryGetIntConstantLowerBound(pVVar6,&local_38,false), !bVar4)) ||
       (local_38 < 0)))))) {
    KillAllObjectTypes(this,bv);
    return;
  }
  if ((valueOpnd != (Opnd *)0x0) && (valueOpnd->m_type != TyVar)) {
    return;
  }
  if (this->objectTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    return;
  }
  pRVar1 = indirOpnd->m_baseOpnd;
  if (((pRVar1 != (RegOpnd *)0x0) &&
      (pVVar5 = GlobOptBlockData::FindValue
                          (&this->currentBlock->globOptData,&pRVar1->m_sym->super_Sym),
      pVVar5 != (Value *)0x0)) &&
     ((pVVar6 = pVVar5->valueInfo, pVVar6 != (ValueInfo *)0x0 &&
      (bVar4 = ValueType::IsNotNativeArray(&pVVar6->super_ValueType), bVar4)))) {
    if (this->prePassLoop == (Loop *)0x0) {
      return;
    }
    bVar4 = IsSafeToTransferInPrepass(this,pRVar1->m_sym,pVVar6);
    if (bVar4) {
      return;
    }
  }
  this_00 = (this->currentBlock->globOptData).maybeWrittenTypeSyms;
  if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
    pJVar3 = this->alloc;
    this_00->head = (Type_conflict)0x0;
    this_00->lastFoundIndex = (Type_conflict)0x0;
    this_00->alloc = pJVar3;
    this_00->lastUsedNodePrevNextField = (Type)this_00;
    (this->currentBlock->globOptData).maybeWrittenTypeSyms = this_00;
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this_00,this->objectTypeSyms);
  return;
}

Assistant:

void
GlobOpt::KillLiveElems(IR::IndirOpnd * indirOpnd, IR::Opnd * valueOpnd, BVSparse<JitArenaAllocator> * bv, bool inGlobOpt, Func *func)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    // obj.x = 10;
    // obj["x"] = ...;   // This needs to kill obj.x...  We need to kill all fields...
    //
    // Also, 'arguments[i] =' needs to kill all slots even if 'i' is an int.
    //
    // NOTE: we only need to kill slots here, not all fields. It may be good to separate these one day.
    //
    // Regarding the check for type specialization:
    // - Type specialization does not always update the value to a definite type.
    // - The loop prepass is conservative on values even when type specialization occurs.
    // - We check the type specialization status for the sym as well. For the purpose of doing kills, we can assume that
    //   if type specialization happened, that fields don't need to be killed. Note that they may be killed in the next
    //   pass based on the value.
    bool isSafeToTransfer = true;
    if (func->GetThisOrParentInlinerHasArguments() || this->IsNonNumericRegOpnd(indexOpnd, inGlobOpt, &isSafeToTransfer))
    {
        this->KillAllFields(bv); // This also kills all property type values, as the same bit-vector tracks those stack syms
        SetAnyPropertyMayBeWrittenTo();
    }
    else if (inGlobOpt)
    {
        Value * indexValue = indexOpnd ? this->currentBlock->globOptData.FindValue(indexOpnd->GetSym()) : nullptr;
        ValueInfo * indexValueInfo = indexValue ? indexValue->GetValueInfo() : nullptr;
        int indexLowerBound = 0;

        if (!isSafeToTransfer || indirOpnd->GetOffset() < 0 || (indexOpnd && (!indexValueInfo || !indexValueInfo->TryGetIntConstantLowerBound(&indexLowerBound, false) || indexLowerBound < 0)))
        {
            // Write/delete to a non-integer numeric index can't alias a name on the RHS of a dot, but it change object layout
            this->KillAllObjectTypes(bv);
        }
        else if ((!valueOpnd || valueOpnd->IsVar()) && this->objectTypeSyms != nullptr)
        {
            // If we wind up converting a native array, block final-type opt at this point, because we could evolve
            // to a type with the wrong type ID. Do this by noting that we may have evolved any type and so must
            // check it before evolving it further.
            IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
            Value * baseValue = baseOpnd ? this->currentBlock->globOptData.FindValue(baseOpnd->m_sym) : nullptr;
            ValueInfo * baseValueInfo = baseValue ? baseValue->GetValueInfo() : nullptr;
            if (!baseValueInfo || !baseValueInfo->IsNotNativeArray() || 
                (this->IsLoopPrePass() && !this->IsSafeToTransferInPrepass(baseOpnd->m_sym, baseValueInfo)))
            {
                if (this->currentBlock->globOptData.maybeWrittenTypeSyms == nullptr)
                {
                    this->currentBlock->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
                }
                this->currentBlock->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
            }
        }
    }
}